

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O2

vm_register * init_register(void)

{
  vm_register *pvVar1;
  undefined4 *puVar2;
  
  pvVar1 = (vm_register *)calloc(1,0x44);
  if (pvVar1 != (vm_register *)0x0) {
    pvVar1->R6 = 0xffffffff;
    pvVar1->R7 = 0xffffffff;
    return pvVar1;
  }
  puVar2 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar2 = 0xf3;
  __cxa_throw(puVar2,&int::typeinfo,0);
}

Assistant:

vm_register* init_register() {
	int temp{ sizeof(vm_register) };
	vm_register *ptr{ nullptr };
	ptr = (vm_register*)malloc(temp);
	if (ptr!=nullptr)
	{
		memset(ptr, 0, temp);//内存清空
		ptr->R6 = unsigned(-1);//调试寄存器值0xffffffff
		ptr->R7 = unsigned(-1);//调试寄存器值0xffffffff
		return ptr;
	}
	else throw(LVM_RIGISTER_SEGEMENT_ERROR);
}